

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dangical.cpp
# Opt level: O2

void icu_63::initDangiCalZoneAstroCalc(void)

{
  InitialTimeZoneRule *this;
  TimeArrayTimeZoneRule *this_00;
  TimeArrayTimeZoneRule *this_01;
  TimeArrayTimeZoneRule *this_02;
  RuleBasedTimeZone *this_03;
  UnicodeString *in_RSI;
  UErrorCode status;
  ConstChar16Ptr local_100;
  ConstChar16Ptr local_f8;
  ConstChar16Ptr local_f0;
  ConstChar16Ptr local_e8;
  ConstChar16Ptr local_e0;
  UnicodeString local_d8;
  char16_t *local_98;
  char16_t *local_88;
  char16_t *local_78;
  char16_t *local_68;
  char16_t *local_58;
  UDate millis1912 [1];
  UDate millis1898 [1];
  UDate millis1897 [1];
  
  millis1897[0] = -2302128000000.0;
  millis1898[0] = -2270592000000.0;
  millis1912[0] = -1829088000000.0;
  this = (InitialTimeZoneRule *)UMemory::operator_new((UMemory *)0x50,(size_t)in_RSI);
  if (this != (InitialTimeZoneRule *)0x0) {
    local_e0.p_ = L"GMT+8";
    UnicodeString::UnicodeString(&local_d8,'\x01',&local_e0,-1);
    in_RSI = &local_d8;
    InitialTimeZoneRule::InitialTimeZoneRule(this,in_RSI,28800000,0);
    UnicodeString::~UnicodeString(&local_d8);
    local_58 = local_e0.p_;
  }
  this_00 = (TimeArrayTimeZoneRule *)UMemory::operator_new((UMemory *)0x160,(size_t)in_RSI);
  if (this_00 != (TimeArrayTimeZoneRule *)0x0) {
    local_e8.p_ = L"Korean 1897";
    UnicodeString::UnicodeString(&local_d8,'\x01',&local_e8,-1);
    in_RSI = &local_d8;
    TimeArrayTimeZoneRule::TimeArrayTimeZoneRule
              (this_00,in_RSI,25200000,0,millis1897,1,STANDARD_TIME);
    UnicodeString::~UnicodeString(&local_d8);
    local_68 = local_e8.p_;
  }
  this_01 = (TimeArrayTimeZoneRule *)UMemory::operator_new((UMemory *)0x160,(size_t)in_RSI);
  if (this_01 != (TimeArrayTimeZoneRule *)0x0) {
    local_f0.p_ = L"Korean 1898-1911";
    UnicodeString::UnicodeString(&local_d8,'\x01',&local_f0,-1);
    in_RSI = &local_d8;
    TimeArrayTimeZoneRule::TimeArrayTimeZoneRule
              (this_01,in_RSI,28800000,0,millis1898,1,STANDARD_TIME);
    UnicodeString::~UnicodeString(&local_d8);
    local_78 = local_f0.p_;
  }
  this_02 = (TimeArrayTimeZoneRule *)UMemory::operator_new((UMemory *)0x160,(size_t)in_RSI);
  if (this_02 != (TimeArrayTimeZoneRule *)0x0) {
    local_f8.p_ = L"Korean 1912-";
    UnicodeString::UnicodeString(&local_d8,'\x01',&local_f8,-1);
    in_RSI = &local_d8;
    TimeArrayTimeZoneRule::TimeArrayTimeZoneRule
              (this_02,in_RSI,32400000,0,millis1912,1,STANDARD_TIME);
    UnicodeString::~UnicodeString(&local_d8);
    local_88 = local_f8.p_;
  }
  status = U_ZERO_ERROR;
  this_03 = (RuleBasedTimeZone *)UMemory::operator_new((UMemory *)0x70,(size_t)in_RSI);
  local_100.p_ = L"KOREA_ZONE";
  UnicodeString::UnicodeString(&local_d8,'\x01',&local_100,-1);
  RuleBasedTimeZone::RuleBasedTimeZone(this_03,&local_d8,this);
  UnicodeString::~UnicodeString(&local_d8);
  local_98 = local_100.p_;
  RuleBasedTimeZone::addTransitionRule(this_03,(TimeZoneRule *)this_00,&status);
  RuleBasedTimeZone::addTransitionRule(this_03,(TimeZoneRule *)this_01,&status);
  RuleBasedTimeZone::addTransitionRule(this_03,(TimeZoneRule *)this_02,&status);
  RuleBasedTimeZone::complete(this_03,&status);
  if (U_ZERO_ERROR < status) {
    (*(this_03->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[1])(this_03);
    this_03 = (RuleBasedTimeZone *)0x0;
  }
  gDangiCalendarZoneAstroCalc = (TimeZone *)this_03;
  ucln_i18n_registerCleanup_63(UCLN_I18N_DANGI_CALENDAR,calendar_dangi_cleanup);
  return;
}

Assistant:

static void U_CALLCONV initDangiCalZoneAstroCalc(void) {
    U_ASSERT(gDangiCalendarZoneAstroCalc == NULL);
    const UDate millis1897[] = { (UDate)((1897 - 1970) * 365 * kOneDay) }; // some days of error is not a problem here
    const UDate millis1898[] = { (UDate)((1898 - 1970) * 365 * kOneDay) }; // some days of error is not a problem here
    const UDate millis1912[] = { (UDate)((1912 - 1970) * 365 * kOneDay) }; // this doesn't create an issue for 1911/12/20
    InitialTimeZoneRule* initialTimeZone = new InitialTimeZoneRule(UNICODE_STRING_SIMPLE("GMT+8"), 8*kOneHour, 0);
    TimeZoneRule* rule1897 = new TimeArrayTimeZoneRule(UNICODE_STRING_SIMPLE("Korean 1897"), 7*kOneHour, 0, millis1897, 1, DateTimeRule::STANDARD_TIME);
    TimeZoneRule* rule1898to1911 = new TimeArrayTimeZoneRule(UNICODE_STRING_SIMPLE("Korean 1898-1911"), 8*kOneHour, 0, millis1898, 1, DateTimeRule::STANDARD_TIME);
    TimeZoneRule* ruleFrom1912 = new TimeArrayTimeZoneRule(UNICODE_STRING_SIMPLE("Korean 1912-"), 9*kOneHour, 0, millis1912, 1, DateTimeRule::STANDARD_TIME);
    UErrorCode status = U_ZERO_ERROR;
    RuleBasedTimeZone* dangiCalZoneAstroCalc = new RuleBasedTimeZone(UNICODE_STRING_SIMPLE("KOREA_ZONE"), initialTimeZone); // adopts initialTimeZone
    dangiCalZoneAstroCalc->addTransitionRule(rule1897, status); // adopts rule1897
    dangiCalZoneAstroCalc->addTransitionRule(rule1898to1911, status);
    dangiCalZoneAstroCalc->addTransitionRule(ruleFrom1912, status);
    dangiCalZoneAstroCalc->complete(status);
    if (U_SUCCESS(status)) {
        gDangiCalendarZoneAstroCalc = dangiCalZoneAstroCalc;
    } else {
        delete dangiCalZoneAstroCalc;
        gDangiCalendarZoneAstroCalc = NULL;
    }
    ucln_i18n_registerCleanup(UCLN_I18N_DANGI_CALENDAR, calendar_dangi_cleanup);
}